

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

bool Js::JavascriptString::LessThan(Var aLeft,Var aRight)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  JavascriptString *__s1;
  JavascriptString *__s2;
  
  bVar2 = VarIs<Js::JavascriptString>(aLeft);
  if (bVar2) {
    bVar2 = VarIs<Js::JavascriptString>(aRight);
    if (bVar2) goto LAB_00bc2837;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                              ,0xc69,
                              "(VarIs<JavascriptString>(aLeft) && VarIs<JavascriptString>(aRight))",
                              "string LessThan");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00bc2837:
  __s1 = VarTo<Js::JavascriptString>(aLeft);
  __s2 = VarTo<Js::JavascriptString>(aRight);
  iVar3 = strcmp((char *)__s1,(char *)__s2);
  return SUB41((uint)iVar3 >> 0x1f,0);
}

Assistant:

bool JavascriptString::LessThan(Var aLeft, Var aRight)
    {
        AssertMsg(VarIs<JavascriptString>(aLeft) && VarIs<JavascriptString>(aRight), "string LessThan");

        JavascriptString *leftString  = VarTo<JavascriptString>(aLeft);
        JavascriptString *rightString = VarTo<JavascriptString>(aRight);

        if (JavascriptString::strcmp(leftString, rightString) < 0)
        {
            return true;
        }
        return false;
    }